

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

function<int_()> * __thiscall
cmake::BuildWorkflowStep
          (function<int_()> *__return_storage_ptr__,cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  StdioConfiguration SVar1;
  StdioConfiguration SVar2;
  cmUVProcessChainBuilder *pcVar3;
  StdioConfiguration *pSVar4;
  cmUVProcessChainBuilder builder;
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  local_d0;
  StdioConfiguration local_b8;
  StdioConfiguration local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  StdioConfiguration SStack_a0;
  StdioConfiguration local_98;
  StdioConfiguration SStack_90;
  undefined1 local_80 [88];
  StdioConfiguration SStack_28;
  
  cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_80);
  pcVar3 = cmUVProcessChainBuilder::AddCommand((cmUVProcessChainBuilder *)local_80,args);
  pcVar3 = cmUVProcessChainBuilder::SetExternalStream(pcVar3,Stream_OUTPUT,_stdout);
  cmUVProcessChainBuilder::SetExternalStream(pcVar3,Stream_ERROR,_stderr);
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::vector(&local_d0,
           (vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
            *)(local_80 + 0x18));
  local_b8 = (StdioConfiguration)&local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,local_80._48_8_,(pointer)(local_80._48_8_ + local_80._56_8_));
  local_98.Type = local_80._80_4_;
  local_98.FileDescriptor = local_80._84_4_;
  SStack_90 = SStack_28;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  pSVar4 = (StdioConfiguration *)operator_new(0x60);
  pSVar4[2].Type = local_80._16_4_;
  pSVar4[2].FileDescriptor = local_80._20_4_;
  pSVar4->Type = local_80._0_4_;
  pSVar4->FileDescriptor = local_80._4_4_;
  pSVar4[1].Type = local_80._8_4_;
  pSVar4[1].FileDescriptor = local_80._12_4_;
  pSVar4[3] = (StdioConfiguration)
              local_d0.
              super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pSVar4[4] = (StdioConfiguration)
              local_d0.
              super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  pSVar4[5] = (StdioConfiguration)
              local_d0.
              super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d0.
  super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.
  super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.
  super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar4[6] = (StdioConfiguration)(pSVar4 + 8);
  if (local_b8 == (StdioConfiguration)&local_a8) {
    SVar2._1_7_ = uStack_a7;
    SVar2.Type._0_1_ = local_a8;
    pSVar4[8] = SVar2;
    pSVar4[9] = SStack_a0;
  }
  else {
    pSVar4[6] = local_b8;
    SVar1._1_7_ = uStack_a7;
    SVar1.Type._0_1_ = local_a8;
    pSVar4[8] = SVar1;
  }
  pSVar4[7] = local_b0;
  local_b0.Type = None;
  local_b0.FileDescriptor = 0;
  local_a8 = 0;
  pSVar4[10].Type = local_80._80_4_;
  pSVar4[10].FileDescriptor = local_80._84_4_;
  pSVar4[0xb] = SStack_28;
  *(StdioConfiguration **)&(__return_storage_ptr__->super__Function_base)._M_functor = pSVar4;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmake.cxx:3940:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmake.cxx:3940:10)>
       ::_M_manager;
  local_b8 = (StdioConfiguration)&local_a8;
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&local_d0);
  if ((undefined1 *)local_80._48_8_ != local_80 + 0x40) {
    operator_delete((void *)local_80._48_8_,local_80._64_8_ + 1);
  }
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector((vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
             *)(local_80 + 0x18));
  return __return_storage_ptr__;
}

Assistant:

std::function<int()> cmake::BuildWorkflowStep(
  const std::vector<std::string>& args)
{
  cmUVProcessChainBuilder builder;
  builder.AddCommand(args)
    .SetExternalStream(cmUVProcessChainBuilder::Stream_OUTPUT, stdout)
    .SetExternalStream(cmUVProcessChainBuilder::Stream_ERROR, stderr);
  return [builder]() -> int {
    auto chain = builder.Start();
    chain.Wait();
    return static_cast<int>(chain.GetStatus(0).ExitStatus);
  };
}